

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

bool __thiscall ProString::endsWith(ProString *this,ProString *sub,CaseSensitivity cs)

{
  char16_t *pcVar1;
  undefined1 uVar2;
  CutResult CVar3;
  char16_t *pcVar4;
  long lVar5;
  long lVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->m_string).d.ptr;
  local_40 = (long)this->m_offset;
  local_48 = (long)this->m_length;
  CVar3 = QtPrivate::QContainerImplHelper::mid((this->m_string).d.size,&local_40,&local_48);
  pcVar7 = (char16_t *)0x0;
  lVar5 = 0;
  if (CVar3 != Null) {
    pcVar7 = pcVar1 + local_40;
    lVar5 = local_48;
  }
  pcVar1 = (sub->m_string).d.ptr;
  local_40 = (long)sub->m_offset;
  local_48 = (long)sub->m_length;
  CVar3 = QtPrivate::QContainerImplHelper::mid((sub->m_string).d.size,&local_40,&local_48);
  pcVar4 = (char16_t *)0x0;
  lVar6 = 0;
  if (CVar3 != Null) {
    pcVar4 = pcVar1 + local_40;
    lVar6 = local_48;
  }
  QVar8.m_data = pcVar7;
  QVar8.m_size = lVar5;
  QVar9.m_data = pcVar4;
  QVar9.m_size = lVar6;
  uVar2 = QtPrivate::endsWith(QVar8,QVar9,cs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)uVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool endsWith(const ProString &sub, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().endsWith(sub.toQStringView(), cs); }